

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

int handle_frame(int fd,long currcms)

{
  __u8 *p_Var1;
  __u8 *p_Var2;
  byte *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  __suseconds_t _Var8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar13;
  long lVar14;
  canfd_frame *pcVar15;
  canfd_frame *pcVar16;
  char *__s;
  long lVar17;
  byte bVar18;
  canfd_frame cf;
  long lVar12;
  
  bVar18 = 0;
  uVar9 = read(fd,&cf,0x48);
  if ((int)(uint)uVar9 < 0) {
    __s = "raw read";
LAB_001021cb:
    perror(__s);
    return 0;
  }
  uVar10 = (uint)uVar9 & 0x7fffffff;
  if ((uVar10 != 0x10) && (uVar10 != 0x48)) {
    printf("received strange frame data length %d!\n",uVar9 & 0xffffffff);
    return 0;
  }
  if (canfd_mode == 2) {
    if (uVar10 == 0x10) {
      canfd_mode = 0;
      max_dlen = '\0';
      name_sep = 0;
      print_ascii = 1;
    }
    else {
      canfd_mode = 1;
    }
  }
  else {
    if (uVar10 == 0x48 && canfd_mode == 0) {
      return 1;
    }
    if (uVar10 == 0x10 && canfd_mode == 1) {
      return 1;
    }
  }
  if ((int)cf.can_id < 0 && (print_eff & 1) == 0) {
    print_eff = 1;
    clearscreen = 0;
  }
  uVar10 = sniftab_index(cf.can_id);
  if ((int)uVar10 < 0) {
    if (0x7ff < idx) {
      __s = "number of different CAN IDs exceeded MAX_SLOTS";
      goto LAB_001021cb;
    }
    bVar5 = true;
    uVar11 = idx;
    idx = idx + 1;
  }
  else {
    bVar5 = true;
    uVar11 = uVar10;
    if (cf.len == sniftab[uVar10].current.len) {
      uVar9 = 0;
      do {
        bVar5 = cf.len != uVar9;
        if (cf.len == uVar9) break;
        p_Var1 = cf.data + uVar9;
        p_Var2 = (__u8 *)((ulong)uVar10 * 0x158 + 0x106208 + uVar9);
        uVar9 = uVar9 + 1;
      } while (*p_Var1 == *p_Var2);
    }
  }
  lVar12 = (long)(int)uVar11;
  lVar13 = lVar12 * 0x158;
  if (sniftab[lVar12].laststamp.tv_sec == 0) {
    bVar5 = (bool)(sniftab[lVar12].laststamp.tv_usec == 0 | bVar5);
  }
  if (bVar5) {
    uVar6 = *(undefined4 *)((long)&sniftab[lVar12].currstamp.tv_sec + 4);
    _Var8 = sniftab[lVar12].currstamp.tv_usec;
    uVar7 = *(undefined4 *)((long)&sniftab[lVar12].currstamp.tv_usec + 4);
    *(int *)&sniftab[lVar12].laststamp.tv_sec = (int)sniftab[lVar12].currstamp.tv_sec;
    *(undefined4 *)((long)&sniftab[lVar12].laststamp.tv_sec + 4) = uVar6;
    *(int *)&sniftab[lVar12].laststamp.tv_usec = (int)_Var8;
    *(undefined4 *)((long)&sniftab[lVar12].laststamp.tv_usec + 4) = uVar7;
    lVar17 = 0;
    ioctl(fd,0x8906,lVar13 + 0x1061a8);
    pcVar15 = &cf;
    pcVar16 = &sniftab[lVar12].current;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      uVar4 = *(undefined8 *)pcVar15;
      pcVar16->can_id = (int)uVar4;
      pcVar16->len = (char)((ulong)uVar4 >> 0x20);
      pcVar16->flags = (char)((ulong)uVar4 >> 0x28);
      pcVar16->__res0 = (char)((ulong)uVar4 >> 0x30);
      pcVar16->__res1 = (char)((ulong)uVar4 >> 0x38);
      pcVar15 = (canfd_frame *)((long)pcVar15 + ((ulong)bVar18 * -2 + 1) * 8);
      pcVar16 = (canfd_frame *)((long)pcVar16 + ((ulong)bVar18 * -2 + 1) * 8);
    }
    lVar14 = 8;
    if (max_dlen != '\0') {
      lVar14 = 0x40;
    }
    for (; lVar14 != lVar17; lVar17 = lVar17 + 1) {
      pbVar3 = (byte *)(lVar13 + 0x106250 + lVar17);
      *pbVar3 = *pbVar3 | *(byte *)(lVar13 + 0x1061c0 + lVar17) ^
                          *(byte *)(lVar13 + 0x106208 + lVar17);
    }
    lVar13 = currcms + timeout;
    if (timeout == 0) {
      lVar13 = 0;
    }
    sniftab[lVar12].timeout = lVar13;
    uVar11 = sniftab[lVar12].flags;
    if ((uVar11 & 2) == 0) {
      clearscreen = 0;
    }
    sniftab[lVar12].flags = uVar11 | 6;
  }
  if ((int)uVar10 < 0) {
    qsort(sniftab,(long)idx,0x158,comp);
  }
  return 1;
}

Assistant:

int handle_frame(int fd, long currcms)
{
	bool rx_changed = false;
	bool run_qsort = false;
	int nbytes, i, pos;
	struct canfd_frame cf;

	nbytes = read(fd, &cf, sizeof(cf));
	if (nbytes < 0) {
		perror("raw read");
		return 0; /* quit */
	}

	if ((nbytes != CAN_MTU) && (nbytes != CANFD_MTU)) {
		printf("received strange frame data length %d!\n", nbytes);
		return 0; /* quit */
	}

	/* CAN FD auto mode: switch based on first reception */
	if (canfd_mode == CANFD_AUTO) {
		if (nbytes == CAN_MTU) {
			canfd_mode = CANFD_OFF;
			/* change back auto defaults for Classical CAN */
			max_dlen = CAN_MAX_DLEN;
			name_sep = CC_SEP;
			print_ascii = 1;
		} else {
			canfd_mode = CANFD_ON;
		}
	}

	/* filter for Classical CAN */
	if ((canfd_mode == CANFD_OFF) && (nbytes == CANFD_MTU))
		return 1; /* skip handling */

	/* filter for CAN FD */
	if ((canfd_mode == CANFD_ON) && (nbytes == CAN_MTU))
		return 1; /* skip handling */

	if (!print_eff && (cf.can_id & CAN_EFF_FLAG)) {
		print_eff = 1;
		clearscreen = 1;
	}

	pos = sniftab_index(cf.can_id);
	if (pos < 0) {
		/* CAN ID not existing */
		if (idx >= MAX_SLOTS) {
			/* informative exit */
			perror("number of different CAN IDs exceeded MAX_SLOTS");
			return 0; /* quit */
		}
		/* assign new slot */
		pos = idx++;
		rx_changed = true;
		run_qsort = true;
	}
	else {
		if (cf.len == sniftab[pos].current.len)
			for (i = 0; i < cf.len; i++) {
				if (cf.data[i] != sniftab[pos].current.data[i] ) {
					rx_changed = true;
					break;
				}
			}
		else
			rx_changed = true;
	}

	/* print received frame even if the data didn't change to get a gap time */
	if ((sniftab[pos].laststamp.tv_sec == 0) && (sniftab[pos].laststamp.tv_usec == 0))
		rx_changed = true;

	if (rx_changed == true) {
		sniftab[pos].laststamp = sniftab[pos].currstamp;
		ioctl(fd, SIOCGSTAMP, &sniftab[pos].currstamp);

		sniftab[pos].current = cf;
		for (i = 0; i < max_dlen; i++)
			sniftab[pos].marker.data[i] |= sniftab[pos].current.data[i] ^ sniftab[pos].last.data[i];

		sniftab[pos].timeout = (timeout)?(currcms + timeout):0;

		if (is_clr(pos, DISPLAY))
			clearscreen = 1; /* new entry -> new drawing */

		do_set(pos, DISPLAY);
		do_set(pos, UPDATE);
	}

	if (run_qsort == true)
		qsort(sniftab, idx, sizeof(sniftab[0]), comp);

	return 1; /* ok */
}